

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u8 *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int size;
  int maxPC;
  int x;
  int pc;
  int iAddr;
  u8 *aData;
  int hdr;
  int *pRc_local;
  int nByte_local;
  MemPage *pPg_local;
  
  uVar2 = (uint)pPg->hdrOffset;
  puVar1 = pPg->aData;
  x = uVar2 + 1;
  iVar3 = pPg->pBt->usableSize - nByte;
  maxPC = (uint)CONCAT11(puVar1[x],puVar1[(long)x + 1]);
  while( true ) {
    if (iVar3 < maxPC) {
      if (iVar3 + nByte + -4 < maxPC) {
        iVar3 = sqlite3CorruptError(0xfd09);
        *pRc = iVar3;
      }
      return (u8 *)0x0;
    }
    iVar4 = (uint)CONCAT11(puVar1[maxPC + 2],puVar1[(long)(maxPC + 2) + 1]) - nByte;
    if (-1 < iVar4) break;
    x = maxPC;
    uVar5 = (uint)CONCAT11(puVar1[maxPC],puVar1[(long)maxPC + 1]);
    uVar6 = maxPC + (uint)CONCAT11(puVar1[maxPC + 2],puVar1[(long)(maxPC + 2) + 1]);
    maxPC = uVar5;
    if (uVar5 <= uVar6) {
      if (uVar5 != 0) {
        iVar3 = sqlite3CorruptError(0xfd02);
        *pRc = iVar3;
      }
      return (u8 *)0x0;
    }
  }
  if (iVar4 < 4) {
    if (0x39 < puVar1[(int)(uVar2 + 7)]) {
      return (u8 *)0x0;
    }
    *(undefined2 *)(puVar1 + x) = *(undefined2 *)(puVar1 + maxPC);
    puVar1[(int)(uVar2 + 7)] = puVar1[(int)(uVar2 + 7)] + (u8)iVar4;
  }
  else {
    if (iVar3 < iVar4 + maxPC) {
      iVar3 = sqlite3CorruptError(0xfcf4);
      *pRc = iVar3;
      return (u8 *)0x0;
    }
    puVar1[maxPC + 2] = (u8)((uint)iVar4 >> 8);
    puVar1[(long)(maxPC + 2) + 1] = (u8)iVar4;
  }
  return puVar1 + (maxPC + iVar4);
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;            /* Offset to page header */
  u8 * const aData = pPg->aData;             /* Page data */
  int iAddr = hdr + 1;                       /* Address of ptr to pc */
  int pc = get2byte(&aData[iAddr]);          /* Address of a free slot */
  int x;                                     /* Excess size of the slot */
  int maxPC = pPg->pBt->usableSize - nByte;  /* Max address for a usable slot */
  int size;                                  /* Size of the free slot */

  assert( pc>0 );
  while( pc<=maxPC ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    size = get2byte(&aData[pc+2]);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
      }else if( x+pc > maxPC ){
        /* This slot extends off the end of the usable part of the page */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
        ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pc = get2byte(&aData[pc]);
    if( pc<=iAddr+size ){
      if( pc ){
        /* The next slot in the chain is not past the end of the current slot */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
      }
      return 0;
    }
  }
  if( pc>maxPC+nByte-4 ){
    /* The free slot chain extends off the end of the page */
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }
  return 0;
}